

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsTime
helicsFederateRequestTimeAdvance(HelicsFederate fed,HelicsTime timeDelta,HelicsError *err)

{
  Federate *this;
  Time TVar1;
  long lVar2;
  HelicsTime HVar3;
  
  this = getFed(fed,err);
  if (this == (Federate *)0x0) {
    HVar3 = -1.785e+39;
  }
  else {
    if (timeDelta <= -9223372036.854765) {
      lVar2 = -0x7fffffffffffffff;
    }
    else {
      lVar2 = 0x7fffffffffffffff;
      if (timeDelta < 9223372036.854765) {
        lVar2 = (long)(timeDelta * 1000000000.0 +
                      *(double *)(&DAT_004366c0 + (ulong)(0.0 <= timeDelta * 1000000000.0) * 8));
      }
    }
    TVar1 = helics::Federate::requestTime
                      (this,(Time)(lVar2 + (this->mCurrentTime).internalTimeCode));
    if (TVar1.internalTimeCode == 0x7fffffffffffffff) {
      HVar3 = 9223372036.854774;
    }
    else {
      HVar3 = (double)(TVar1.internalTimeCode % 1000000000) * 1e-09 +
              (double)(TVar1.internalTimeCode / 1000000000);
    }
  }
  return HVar3;
}

Assistant:

HelicsTime helicsFederateRequestTimeAdvance(HelicsFederate fed, HelicsTime timeDelta, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestTimeAdvance(timeDelta);
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}